

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_functional.h
# Opt level: O0

void __thiscall
mp::
BasicFCC<mp::FCC<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::NumberofConstId>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::NumberofConstId>_>
::AddResultVariable(BasicFCC<mp::FCC<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::NumberofConstId>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::NumberofConstId>_>
                    *this)

{
  int v;
  BasicFCC<mp::FCC<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::NumberofConstId>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::NumberofConstId>_>
  *this_00;
  CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::NumberofConstId>
  *this_01;
  BasicFCC<mp::FCC<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::NumberofConstId>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::NumberofConstId>_>
  *in_RDI;
  double lb;
  FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *this_02;
  int r;
  Type in_stack_ffffffffffffffbc;
  
  this_00 = (BasicFCC<mp::FCC<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::NumberofConstId>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::NumberofConstId>_>
             *)GetConverter(in_RDI);
  lb = BasicFCC<mp::FCC<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::NumberofConstId>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::NumberofConstId>_>
       ::lb(in_RDI);
  this_02 = (FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
             *)ub(in_RDI);
  type(in_RDI);
  FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  ::AddVar(this_02,lb,(double)this_00,in_stack_ffffffffffffffbc);
  v = pre::NodeRange::operator_cast_to_int((NodeRange *)0x64f0b3);
  SetResultVar(this_00,in_stack_ffffffffffffffbc);
  this_01 = GetConstraint(in_RDI);
  FunctionalConstraint::SetResultVar(&this_01->super_FunctionalConstraint,v);
  return;
}

Assistant:

void AddResultVariable() {
    auto r = int( GetConverter().AddVar(lb(), ub(), type()) );
    SetResultVar( r );
    GetConstraint().SetResultVar( r );
	}